

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

float __thiscall SVGChart::LogTickIterator::RoundDown(LogTickIterator *this,float inFloat)

{
  float inBase;
  float fVar1;
  double dVar2;
  
  inBase = ((this->super_TickIterator).mAxisSetup)->mLogBase;
  fVar1 = SafeLog(inFloat,inBase,1.0);
  fVar1 = floorf(fVar1);
  dVar2 = pow((double)inBase,(double)(int)fVar1);
  return (float)dVar2;
}

Assistant:

float LogTickIterator::RoundDown (float inFloat) const {
      float theBase = mAxisSetup->mLogBase;
      long theLogFac = 1;//mAxisSetup->mLogFactor;
      int thePow = (int)floor(SafeLog(inFloat,theBase, theLogFac));
      return pow (theBase, thePow);
    }